

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastReduceMatrix
               (Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes,int fSigned,
               int fCla)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *pNew_00;
  int iVar2;
  int iVar3;
  int b;
  int c;
  int a;
  int b_00;
  int b_01;
  int *piVar4;
  int *piVar5;
  int nSize;
  int Level3;
  int Level2;
  int Level1;
  int Node3;
  int Node2;
  int Node1;
  int LevelC;
  int LevelS;
  int NodeC;
  int NodeS;
  int i;
  Vec_Int_t *vProd;
  Vec_Int_t *vLevel;
  int fCla_local;
  int fSigned_local;
  Vec_Int_t *vRes_local;
  Vec_Wec_t *vLevels_local;
  Vec_Wec_t *vProds_local;
  Gia_Man_t *pNew_local;
  
  vLevel._0_4_ = fCla;
  vLevel._4_4_ = fSigned;
  _fCla_local = vRes;
  vRes_local = (Vec_Int_t *)vLevels;
  vLevels_local = vProds;
  vProds_local = (Vec_Wec_t *)pNew;
  iVar2 = Vec_WecSize(vProds);
  iVar3 = Vec_WecSize((Vec_Wec_t *)vRes_local);
  if (iVar2 != iVar3) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x363,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                 );
  }
  for (NodeC = 0; NodeC < iVar2; NodeC = NodeC + 1) {
    while( true ) {
      _NodeS = Vec_WecEntry(vLevels_local,NodeC);
      iVar3 = Vec_IntSize(_NodeS);
      if (iVar3 < 3) break;
      iVar3 = Vec_IntPop(_NodeS);
      b = Vec_IntPop(_NodeS);
      c = Vec_IntPop(_NodeS);
      vProd = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC);
      a = Vec_IntPop(vProd);
      b_00 = Vec_IntPop(vProd);
      b_01 = Vec_IntPop(vProd);
      Wlc_BlastFullAdder((Gia_Man_t *)vProds_local,iVar3,b,c,&LevelC,&LevelS);
      iVar3 = Abc_MaxInt(a,b_00);
      iVar3 = Abc_MaxInt(iVar3,b_01);
      Wlc_IntInsert(_NodeS,vProd,LevelS,iVar3 + 2);
      _NodeS = Vec_WecEntry(vLevels_local,NodeC + 1);
      vProd = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC + 1);
      Wlc_IntInsert(_NodeS,vProd,LevelC,iVar3 + 1);
    }
  }
  NodeC = 0;
  while( true ) {
    if (iVar2 <= NodeC) {
      vProd = Vec_WecEntry((Vec_Wec_t *)vRes_local,0);
      Vec_IntClear(_fCla_local);
      Vec_IntClear(vProd);
      for (NodeC = 0; NodeC < iVar2; NodeC = NodeC + 1) {
        _NodeS = Vec_WecEntry(vLevels_local,NodeC);
        pVVar1 = _fCla_local;
        iVar3 = Vec_IntEntry(_NodeS,0);
        Vec_IntPush(pVVar1,iVar3);
        pVVar1 = vProd;
        iVar3 = Vec_IntEntry(_NodeS,1);
        Vec_IntPush(pVVar1,iVar3);
      }
      Vec_IntPush(_fCla_local,0);
      Vec_IntPush(vProd,0);
      pNew_00 = vProds_local;
      if ((int)vLevel == 0) {
        piVar4 = Vec_IntArray(_fCla_local);
        piVar5 = Vec_IntArray(vProd);
        iVar2 = Vec_IntSize(_fCla_local);
        Wlc_BlastAdder((Gia_Man_t *)pNew_00,piVar4,piVar5,iVar2,0);
      }
      else {
        piVar4 = Vec_IntArray(_fCla_local);
        piVar5 = Vec_IntArray(vProd);
        iVar2 = Vec_IntSize(_fCla_local);
        Wlc_BlastAdderCLA((Gia_Man_t *)pNew_00,piVar4,piVar5,iVar2,vLevel._4_4_,0);
      }
      return;
    }
    _NodeS = Vec_WecEntry(vLevels_local,NodeC);
    while (iVar3 = Vec_IntSize(_NodeS), iVar3 < 2) {
      Vec_IntPush(_NodeS,0);
    }
    iVar3 = Vec_IntSize(_NodeS);
    if (iVar3 != 2) break;
    NodeC = NodeC + 1;
  }
  __assert_fail("Vec_IntSize(vProd) == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x389,
                "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
               );
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,   0 );
    Vec_IntPush( vLevel, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), 0 );
}